

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O2

wchar_t project_player_handler_NETHER(project_player_handler_context_t *context)

{
  uint32_t *puVar1;
  ushort uVar2;
  player *ppVar3;
  _Bool _Var4;
  uint32_t uVar5;
  int iVar6;
  long lVar7;
  int16_t iVar8;
  int iVar9;
  player_state_conflict *ppVar10;
  undefined1 *puVar11;
  player_state_conflict in_stack_fffffffffffffe98;
  
  iVar6 = player->exp;
  uVar2 = z_info->life_drain_percent;
  ppVar10 = &player->state;
  puVar11 = &stack0xfffffffffffffe98;
  for (lVar7 = 0x13c; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar11 = (char)ppVar10->stat_add[0];
    ppVar10 = (player_state_conflict *)((long)ppVar10->stat_add + 1);
    puVar11 = puVar11 + 1;
  }
  _Var4 = player_resists_effects(in_stack_fffffffffffffe98,L'\n');
  if ((_Var4) || (_Var4 = player_of_has(player,L'\x10'), _Var4)) {
    msg("You resist the effect!");
    equip_learn_flag(player,L'\x10');
    return L'\0';
  }
  msg("You feel your life force draining away!");
  player_exp_lose(player,(iVar6 / 100) * (uint)uVar2 + 200,false);
  if (context->power < L'P') {
    return L'\0';
  }
  uVar5 = Rand_div(context->dam);
  if ((100 < (int)uVar5) && (player->msp != 0)) {
    msg("Your mind is dulled.");
    ppVar3 = player;
    iVar6 = context->dam / 10;
    iVar9 = player->csp - iVar6;
    iVar8 = (int16_t)iVar9;
    if (iVar9 == 0 || player->csp < iVar6) {
      iVar8 = 0;
    }
    player->csp = iVar8;
    puVar1 = &ppVar3->upkeep->redraw;
    *puVar1 = *puVar1 | 0x80;
  }
  uVar5 = Rand_div(context->dam);
  if ((int)uVar5 < 0xc9) {
    return L'\0';
  }
  msg("Your energy is sapped!");
  player->energy = 0;
  return L'\0';
}

Assistant:

static int project_player_handler_NETHER(project_player_handler_context_t *context)
{
	int drain = 200 + (player->exp / 100) * z_info->life_drain_percent;

	if (player_resists_effects(player->state, ELEM_NETHER) ||
		player_of_has(player, OF_HOLD_LIFE)) {
		msg("You resist the effect!");
		equip_learn_flag(player, OF_HOLD_LIFE);
		return 0;
	}

	/* Life draining */
	msg("You feel your life force draining away!");
	player_exp_lose(player, drain, false);

	/* Powerful nether attacks have further side-effects */
	if (context->power >= 80) {
		/* Mana loss */
		if ((randint0(context->dam) > 100) && player->msp) {
			msg("Your mind is dulled.");
			player->csp -= MIN(player->csp, context->dam / 10);
			player->upkeep->redraw |= PR_MANA;
		}

		/* Loss of energy */
		if (randint0(context->dam) > 200) {
			msg("Your energy is sapped!");
			player->energy = 0;
		}
	}
	return 0;
}